

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O1

string * __thiscall
pbrt::Bounds3<float>::ToString_abi_cxx11_(string *__return_storage_ptr__,Bounds3<float> *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::Point3<float>const&,pbrt::Point3<float>const&>
            (__return_storage_ptr__,"[ %s - %s ]",&this->pMin,&this->pMax);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const { return StringPrintf("[ %s - %s ]", pMin, pMax); }